

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableEndRow(ImGuiTable *table)

{
  ImSpan<ImGuiTableColumn> *this;
  float fVar1;
  char cVar2;
  ImDrawList *pIVar3;
  ImDrawListSplitter *this_00;
  ImGuiContext *pIVar4;
  ImRect IVar5;
  ImRect IVar6;
  ImGuiTableCellData *pIVar7;
  ImGuiTableColumn *pIVar8;
  int column_n;
  int iVar9;
  int iVar10;
  int iVar11;
  ImU32 col;
  ImGuiWindow *window;
  int iVar12;
  ImU32 col_00;
  uint uVar13;
  float fVar14;
  float fVar15;
  ImRect row_rect;
  ImRect local_70;
  float local_60;
  float local_5c;
  int local_58;
  int local_54;
  ImU32 local_50;
  int local_4c;
  ImGuiWindow *local_48;
  ImGuiTableCellData *local_40;
  ImVec2 local_38;
  
  pIVar4 = GImGui;
  window = GImGui->CurrentWindow;
  if (window != table->InnerWindow) {
    __assert_fail("window == table->InnerWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x6b7,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if (table->IsInsideRow == false) {
    __assert_fail("table->IsInsideRow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x6b8,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if (table->CurrentColumn != -1) {
    TableEndCell(table);
  }
  if (pIVar4->LogEnabled == true) {
    LogRenderedText((ImVec2 *)0x0,"|",(char *)0x0);
  }
  fVar1 = table->RowPosY2;
  (window->DC).CursorPos.y = fVar1;
  fVar15 = table->RowPosY1;
  iVar10 = table->CurrentRow;
  if (iVar10 == 0) {
    table->LastFirstRowHeight = fVar1 - fVar15;
  }
  iVar12 = iVar10 + 1;
  iVar11 = (int)table->FreezeRowsCount;
  iVar9 = (int)table->FreezeRowsRequest;
  if (((table->InnerClipRect).Min.y <= fVar1) && (fVar15 <= (table->InnerClipRect).Max.y)) {
    col = table->RowBgColor[0];
    local_60 = fVar15;
    local_5c = fVar1;
    local_58 = iVar11;
    local_54 = iVar12;
    if ((col == 0x1000000) && (col = 0, (table->Flags & 0x40) != 0)) {
      col = GetColorU32((table->RowBgColorCounter & 1U) + 0x2d,1.0);
      iVar10 = table->CurrentRow;
    }
    col_00 = table->RowBgColor[1];
    local_50 = 0;
    if (col_00 == 0x1000000) {
      col_00 = 0;
    }
    if (((0 < iVar10) || (table->InnerWindow == table->OuterWindow)) &&
       (local_50 = 0, (table->Flags & 0x80) != 0)) {
      local_50 = table->RowBgColor[(ulong)((table->field_0x9a & 1) == 0) + 2];
    }
    cVar2 = table->RowCellDataCurrent;
    local_4c = iVar9;
    if ((-1 < cVar2 || local_54 == local_58) || (local_50 != 0 || (col_00 != 0 || col != 0))) {
      if ((table->Flags & 0x100000) == 0) {
        fVar1 = (table->Bg0ClipRectForDrawCmd).Min.y;
        fVar15 = (table->Bg0ClipRectForDrawCmd).Max.x;
        fVar14 = (table->Bg0ClipRectForDrawCmd).Max.y;
        pIVar3 = window->DrawList;
        (pIVar3->_CmdHeader).ClipRect.x = (table->Bg0ClipRectForDrawCmd).Min.x;
        (pIVar3->_CmdHeader).ClipRect.y = fVar1;
        (pIVar3->_CmdHeader).ClipRect.z = fVar15;
        (pIVar3->_CmdHeader).ClipRect.w = fVar14;
      }
      ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,window->DrawList,0);
    }
    if (col_00 != 0 || col != 0) {
      local_70.Min.y = local_60;
      local_70.Min.x = (table->WorkRect).Min.x;
      local_70.Max.x = (table->WorkRect).Max.x;
      local_70.Max.y = local_5c;
      ImRect::ClipWith(&local_70,&table->BgClipRect);
      if ((col != 0) && (local_70.Min.y < local_70.Max.y)) {
        ImDrawList::AddRectFilled(window->DrawList,&local_70.Min,&local_70.Max,col,0.0,0);
      }
      if ((col_00 != 0) && (local_70.Min.y < local_70.Max.y)) {
        ImDrawList::AddRectFilled(window->DrawList,&local_70.Min,&local_70.Max,col_00,0.0,0);
      }
    }
    local_48 = window;
    if (-1 < cVar2) {
      local_40 = ImSpan<ImGuiTableCellData>::operator[]
                           (&table->RowCellData,(int)table->RowCellDataCurrent);
      pIVar7 = ImSpan<ImGuiTableCellData>::operator[](&table->RowCellData,0);
      for (; pIVar7 <= local_40; pIVar7 = pIVar7 + 1) {
        pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)pIVar7->Column);
        local_70 = TableGetCellBgRect(table,(int)pIVar7->Column);
        ImRect::ClipWith(&local_70,&table->BgClipRect);
        IVar5 = local_70;
        fVar1 = (pIVar8->ClipRect).Min.x;
        fVar15 = local_70.Max.x;
        uVar13 = -(uint)(fVar1 <= local_70.Min.x);
        local_70.Min.x = (float)(uVar13 & (uint)local_70.Min.x | ~uVar13 & (uint)fVar1);
        IVar6 = local_70;
        if (pIVar8->MaxX <= fVar15) {
          fVar15 = pIVar8->MaxX;
        }
        local_70.Max.y = IVar5.Max.y;
        local_70.Min = IVar6.Min;
        local_70.Max.x = fVar15;
        ImDrawList::AddRectFilled
                  (local_48->DrawList,&local_70.Min,&local_70.Max,pIVar7->BgColor,0.0,0);
      }
    }
    window = local_48;
    if (((local_50 != 0) && ((table->BgClipRect).Min.y <= local_60)) &&
       (local_60 < (table->BgClipRect).Max.y)) {
      local_70.Min.y = local_60;
      local_70.Min.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = local_60;
      ImDrawList::AddLine(local_48->DrawList,&local_70.Min,&local_38,local_50,1.0);
    }
    iVar9 = local_4c;
    iVar12 = local_54;
    iVar11 = local_58;
    if (((local_54 == local_58) && ((table->BgClipRect).Min.y <= local_5c)) &&
       (local_5c < (table->BgClipRect).Max.y)) {
      local_70.Min.y = local_5c;
      local_70.Min.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = local_5c;
      ImDrawList::AddLine(window->DrawList,&local_70.Min,&local_38,table->BorderColorStrong,1.0);
    }
  }
  if (iVar12 == iVar9) {
    for (iVar10 = 0; iVar10 < table->ColumnsCount; iVar10 = iVar10 + 1) {
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,iVar10);
      pIVar8->NavLayerCurrent = iVar10 < table->FreezeColumnsCount;
    }
  }
  if (iVar12 == iVar11) {
    if (table->IsUnfrozenRows != false) {
      __assert_fail("table->IsUnfrozenRows == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                    ,0x71b,"void ImGui::TableEndRow(ImGuiTable *)");
    }
    table->IsUnfrozenRows = true;
    fVar1 = table->RowPosY2;
    fVar15 = (window->InnerClipRect).Min.y;
    fVar14 = (window->InnerClipRect).Max.y;
    uVar13 = -(uint)(fVar15 <= fVar1 + 1.0);
    fVar15 = (float)(~uVar13 & (uint)fVar15 | (uint)(fVar1 + 1.0) & uVar13);
    if (fVar14 <= fVar15) {
      fVar15 = fVar14;
    }
    (table->Bg2ClipRectForDrawCmd).Min.y = fVar15;
    (table->BgClipRect).Min.y = fVar15;
    (table->Bg2ClipRectForDrawCmd).Max.y = fVar14;
    (table->BgClipRect).Max.y = fVar14;
    table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
    if (fVar14 < fVar15) {
      __assert_fail("table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                    ,0x723,"void ImGui::TableEndRow(ImGuiTable *)");
    }
    fVar15 = table->RowPosY1;
    fVar14 = (fVar1 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
    (window->DC).CursorPos.y = fVar14;
    table->RowPosY2 = fVar14;
    table->RowPosY1 = fVar14 - (fVar1 - fVar15);
    this = &table->Columns;
    for (iVar10 = 0; iVar10 < table->ColumnsCount; iVar10 = iVar10 + 1) {
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[](this,iVar10);
      pIVar8->DrawChannelCurrent = pIVar8->DrawChannelUnfrozen;
      (pIVar8->ClipRect).Min.y = (table->Bg2ClipRectForDrawCmd).Min.y;
    }
    pIVar8 = ImSpan<ImGuiTableColumn>::operator[](this,0);
    SetWindowClipRectBeforeSetChannel(window,&pIVar8->ClipRect);
    this_00 = table->DrawSplitter;
    pIVar3 = window->DrawList;
    pIVar8 = ImSpan<ImGuiTableColumn>::operator[](this,0);
    ImDrawListSplitter::SetCurrentChannel(this_00,pIVar3,(uint)pIVar8->DrawChannelCurrent);
  }
  if ((table->field_0x98 & 1) == 0) {
    table->RowBgColorCounter = table->RowBgColorCounter + 1;
  }
  table->IsInsideRow = false;
  return;
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Logging
    if (g.LogEnabled)
        LogRenderedText(NULL, "|");

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        table->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter->SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter->SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}